

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteSInt32
               (int field_number,int32_t value,CodedOutputStream *output)

{
  CodedOutputStream *output_local;
  int32_t value_local;
  int field_number_local;
  
  WriteTag(field_number,WIRETYPE_VARINT,output);
  WriteSInt32NoTag(value,output);
  return;
}

Assistant:

void WireFormatLite::WriteSInt32(int field_number, int32_t value,
                                 io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_VARINT, output);
  WriteSInt32NoTag(value, output);
}